

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

realtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  realtype rVar6;
  
  uVar1 = *x->content;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  dVar4 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = *(double *)(*(long *)((long)x->content + 8) + uVar3 * 8) *
            *(double *)(*(long *)((long)w->content + 8) + uVar3 * 8);
    dVar4 = dVar4 + dVar5 * dVar5;
  }
  rVar6 = 0.0;
  if (0.0 < dVar4) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      return dVar4;
    }
    rVar6 = SQRT(dVar4);
  }
  return rVar6;
}

Assistant:

realtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(SUNRsqrt(sum));
}